

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O2

char * __thiscall test_suite::detail::simple_runner::filename(simple_runner *this,char *file)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = strlen(file);
  do {
    sVar2 = sVar1;
    if (sVar2 == 0) {
      return file;
    }
    sVar1 = sVar2 - 1;
  } while (file[sVar2 - 1] != '/');
  return file + sVar2;
}

Assistant:

char const*
  filename(
      char const* file)
  {
    auto const p0 = file;
    auto p = p0 + std::strlen(file);
    while(p-- != p0)
    {
#ifdef _MSC_VER
      if(*p == '\\')
#else
      if(*p == '/')
#endif
        break;
    }
    return p + 1;
  }